

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

shared_ptr<mocker::ast::FuncDecl> __thiscall
mocker::Parser::funcDecl(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  size_t sVar1;
  size_t sVar2;
  Position beg;
  Position beg_00;
  Position beg_01;
  TokenID TVar3;
  mapped_type *pmVar4;
  CompileError *pCVar5;
  Token *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  Token *pTVar7;
  element_type *this_01;
  bool bVar8;
  shared_ptr<mocker::ast::Type> sVar9;
  shared_ptr<mocker::ast::Identifier> sVar10;
  shared_ptr<mocker::ast::FuncDecl> sVar11;
  Position beg_02;
  Position beg_03;
  Position end_00;
  Position end_01;
  shared_ptr<mocker::ast::CompoundStmt> body;
  Parser local_d0;
  undefined1 local_b0 [32];
  element_type *local_90;
  shared_ptr<mocker::ast::Identifier> paramName;
  shared_ptr<mocker::ast::Identifier> ident;
  vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
  formalParam;
  element_type *local_48;
  shared_ptr<mocker::ast::Type> retType;
  
  this_00 = *end._M_current;
  local_90 = (element_type *)this;
  sVar9 = type(&local_d0,iter,end);
  _Var6 = sVar9.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_d0.tokBeg._M_current == (Token *)0x0) {
    pTVar7 = *end._M_current;
    *(Token **)end._M_current = pTVar7 + 1;
    bVar8 = true;
    if ((pTVar7 == in_RCX) ||
       (TVar3 = Token::tokenID(pTVar7), _Var6._M_pi = extraout_RDX_00, TVar3 != Void))
    goto LAB_0017ef12;
  }
  sVar10 = identifier((Parser *)local_b0,iter,end);
  _Var6 = sVar10.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi;
  if ((Token *)local_b0._0_8_ == (Token *)0x0) {
    bVar8 = true;
  }
  else {
    pTVar7 = *end._M_current;
    *(Token **)end._M_current = pTVar7 + 1;
    if (pTVar7 == in_RCX) {
      TVar3 = Error;
    }
    else {
      TVar3 = Token::tokenID(pTVar7);
      _Var6._M_pi = extraout_RDX;
    }
    bVar8 = TVar3 != LeftParen;
  }
  if ((Token *)local_b0._8_8_ != (Token *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
    _Var6._M_pi = extraout_RDX_01;
  }
LAB_0017ef12:
  if (local_d0.tokEnd._M_current != (Token *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0.tokEnd._M_current);
    _Var6._M_pi = extraout_RDX_02;
  }
  *(Token **)end._M_current = this_00;
  if (bVar8) {
    (local_90->super_Declaration).super_ASTNode._vptr_ASTNode = (_func_int **)0x0;
    (local_90->super_Declaration).super_ASTNode.super_enable_shared_from_this<mocker::ast::ASTNode>.
    _M_weak_this.super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    this_01 = local_90;
  }
  else {
    type((Parser *)&retType,iter,end);
    if (retType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if ((*end._M_current == in_RCX) || (TVar3 = Token::tokenID(*end._M_current), TVar3 != Void)) {
        __assert_fail("id(iter) == TokenID::Void",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                      ,0x285,
                      "std::shared_ptr<ast::FuncDecl> mocker::Parser::funcDecl(TokIter &, TokIter)")
        ;
      }
      *(long *)end._M_current = *(long *)end._M_current + 0x38;
    }
    identifier((Parser *)&ident,iter,end);
    formalParam.
    super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    formalParam.
    super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    formalParam.
    super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((Token *)(*(long *)end._M_current + 0x38) == in_RCX) ||
       (TVar3 = Token::tokenID((Token *)(*(long *)end._M_current + 0x38)), TVar3 != RightParen)) {
      do {
        *(long *)end._M_current = *(long *)end._M_current + 0x38;
        type((Parser *)&body,iter,end);
        if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          pCVar5 = (CompileError *)__cxa_allocate_exception(0x48);
          Token::position(this_00);
          Token::position(*end._M_current);
          beg.col = (size_t)local_d0.tokEnd._M_current;
          beg.line = (size_t)local_d0.tokBeg._M_current;
          CompileError::CompileError(pCVar5,beg,(Position)local_b0._16_16_);
          *(undefined ***)pCVar5 = &PTR__CompileError_001eba98;
          __cxa_throw(pCVar5,&SyntaxError::typeinfo,CompileError::~CompileError);
        }
        identifier((Parser *)&paramName,iter,end);
        if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          pCVar5 = (CompileError *)__cxa_allocate_exception(0x48);
          Token::position(this_00);
          Token::position(*end._M_current);
          beg_00.col = (size_t)local_d0.tokEnd._M_current;
          beg_00.line = (size_t)local_d0.tokBeg._M_current;
          CompileError::CompileError(pCVar5,beg_00,(Position)local_b0._16_16_);
          *(undefined ***)pCVar5 = &PTR__CompileError_001eba98;
          __cxa_throw(pCVar5,&SyntaxError::typeinfo,CompileError::~CompileError);
        }
        local_b0._0_8_ =
             body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pmVar4 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)iter[2]._M_current,(key_type *)local_b0);
        sVar1 = (pmVar4->first).line;
        sVar2 = (pmVar4->first).col;
        local_48 = paramName.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
        pmVar4 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)iter[2]._M_current,(key_type *)&local_48);
        beg_02.col = sVar1;
        beg_02.line = (size_t)iter;
        end_00.col = (pmVar4->second).line;
        end_00.line = sVar2;
        makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>,std::shared_ptr<mocker::ast::Identifier>>
                  (&local_d0,beg_02,end_00,(shared_ptr<mocker::ast::Type> *)(pmVar4->second).col,
                   (shared_ptr<mocker::ast::Identifier> *)&body);
        std::
        vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>
        ::emplace_back<std::shared_ptr<mocker::ast::VarDeclStmt>>
                  ((vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>
                    *)&formalParam,(shared_ptr<mocker::ast::VarDeclStmt> *)&local_d0);
        if (local_d0.tokEnd._M_current != (Token *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0.tokEnd._M_current);
        }
        if (paramName.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (paramName.
                     super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        pTVar7 = *end._M_current;
        if (pTVar7 == in_RCX) goto LAB_0017f0cf;
        TVar3 = Token::tokenID(pTVar7);
      } while (TVar3 == Comma);
      pTVar7 = *end._M_current;
    }
    else {
      pTVar7 = (Token *)(*(long *)end._M_current + 0x38);
      *(Token **)end._M_current = pTVar7;
    }
LAB_0017f0cf:
    *(Token **)end._M_current = pTVar7 + 1;
    compoundStmt((Parser *)&body,iter,end);
    this_01 = local_90;
    if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pCVar5 = (CompileError *)__cxa_allocate_exception(0x48);
      Token::position(this_00);
      Token::position(*end._M_current);
      beg_01.col = (size_t)local_d0.tokEnd._M_current;
      beg_01.line = (size_t)local_d0.tokBeg._M_current;
      CompileError::CompileError(pCVar5,beg_01,(Position)local_b0._16_16_);
      *(undefined ***)pCVar5 = &PTR__CompileError_001eba98;
      __cxa_throw(pCVar5,&SyntaxError::typeinfo,CompileError::~CompileError);
    }
    Token::position(this_00);
    local_b0._0_8_ =
         body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pmVar4 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)iter[2]._M_current,(key_type *)local_b0);
    beg_03.col = (size_t)local_d0.tokBeg._M_current;
    beg_03.line = (size_t)iter;
    end_01.col = (pmVar4->second).line;
    end_01.line = (size_t)local_d0.tokEnd._M_current;
    makeNode<mocker::ast::FuncDecl,std::shared_ptr<mocker::ast::Type>&,std::shared_ptr<mocker::ast::Identifier>&,std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>>>,std::shared_ptr<mocker::ast::CompoundStmt>&>
              ((Parser *)this_01,beg_03,end_01,(shared_ptr<mocker::ast::Type> *)(pmVar4->second).col
               ,(shared_ptr<mocker::ast::Identifier> *)&retType,
               (vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
                *)&ident,(shared_ptr<mocker::ast::CompoundStmt> *)&formalParam);
    if (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (body.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
    ::~vector(&formalParam);
    _Var6._M_pi = extraout_RDX_03;
    if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var6._M_pi = extraout_RDX_04;
    }
    if (retType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (retType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var6._M_pi = extraout_RDX_05;
    }
  }
  sVar11.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar11.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
  return (shared_ptr<mocker::ast::FuncDecl>)
         sVar11.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::FuncDecl> Parser::funcDecl(TokIter &iter, TokIter end) {
  auto beg = iter;
  auto id = GetTokenID(end);
  auto throwError = [beg, &iter] {
    throw SyntaxError(beg->position().first, iter->position().second);
  };

  if (!(type(iter, end) || id(iter++) == TokenID::Void) ||
      !identifier(iter, end) || id(iter++) != TokenID::LeftParen) {
    iter = beg;
    return nullptr;
  }
  iter = beg;
  auto retType = type(iter, end);
  if (!retType) {
    assert(id(iter) == TokenID::Void);
    iter++;
  }
  auto ident = identifier(iter, end);

  std::vector<std::shared_ptr<ast::VarDeclStmt>> formalParam;
  if (id(iter + 1) != TokenID::RightParen) {
    do {
      // Now [iter] points to a Comma or a LeftParen
      ++iter;
      auto ty = type(iter, end);
      if (!ty)
        throwError();
      auto paramName = identifier(iter, end);
      if (!ident)
        throwError();
      formalParam.emplace_back(makeNode<ast::VarDeclStmt>(
          pos[ty->getID()].first, pos[paramName->getID()].second, std::move(ty),
          std::move(paramName)));
    } while (id(iter) == TokenID::Comma);
  } else {
    ++iter;
  }
  ++iter;
  auto body = compoundStmt(iter, end);
  if (!body)
    throwError();
  return makeNode<ast::FuncDecl>(beg->position().first,
                                 pos[body->getID()].second, retType, ident,
                                 std::move(formalParam), body);
}